

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall CTcTokenizer::look_ahead(CTcTokenizer *this,char *s1,char *s2)

{
  int iVar1;
  tc_toktyp_t tVar2;
  size_t sVar3;
  
  if ((this->curtok_).typ_ == TOKT_SYM) {
    sVar3 = strlen(s1);
    iVar1 = cur_tok_matches(this,s1,sVar3);
    if (iVar1 != 0) {
      tVar2 = next(this);
      if (tVar2 == TOKT_SYM) {
        sVar3 = strlen(s2);
        iVar1 = cur_tok_matches(this,s2,sVar3);
        if (iVar1 != 0) {
          next(this);
          return 1;
        }
      }
      unget(this);
    }
  }
  return 0;
}

Assistant:

int CTcTokenizer::look_ahead(const char *s1, const char *s2)
{
    /* if the first token doesn't match, the sequence doesn't match */
    if (cur() != TOKT_SYM || !cur_tok_matches(s1, strlen(s1)))
        return FALSE;

    /* check the next token - if it matches, we have a sequence match */
    if (next() == TOKT_SYM && cur_tok_matches(s2, strlen(s2)))
    {
        /* got it - skip the second token and return success */
        next();
        return TRUE;
    }

    /* 
     *   no match - but we've already read the next token, so put it back
     *   before we return failure 
     */
    unget();
    return FALSE;
}